

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_image_write_memory(png_voidp argument)

{
  int iVar1;
  png_image_write_control *display;
  png_voidp argument_local;
  
  png_set_write_fn(*(png_structrp *)**argument,argument,image_memory_write,image_memory_flush);
  iVar1 = png_image_write_main(argument);
  return iVar1;
}

Assistant:

static int
png_image_write_memory(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);

   /* The rest of the memory-specific init and write_main in an error protected
    * environment.  This case needs to use callbacks for the write operations
    * since libpng has no built in support for writing to memory.
    */
   png_set_write_fn(display->image->opaque->png_ptr, display/*io_ptr*/,
       image_memory_write, image_memory_flush);

   return png_image_write_main(display);
}